

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

CheckerDeclarationSyntax * __thiscall
slang::parsing::Parser::parseCheckerDeclaration(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  Token semi;
  Info *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  Diagnostic *this_00;
  SourceLocation SVar7;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  CheckerDeclarationSyntax *pCVar8;
  byte bVar9;
  byte bVar10;
  Token TVar11;
  SourceRange range;
  string_view arg;
  Token keyword;
  Token name;
  bool anyLocalModules;
  MemberSyntax *member;
  Token end;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  bool local_145;
  SyntaxKind local_144;
  MemberSyntax *local_140;
  Token *local_138;
  Token *local_130;
  Info *local_128;
  undefined8 local_120;
  AssertionItemPortListSyntax *local_118;
  pointer local_110;
  size_t local_108;
  Info *local_100;
  undefined8 local_f8;
  Info *local_f0;
  undefined8 local_e8;
  Token local_e0;
  Token local_d0;
  SyntaxNode *local_c0;
  SyntaxNode *pSStack_b8;
  pointer local_a8;
  undefined8 local_98;
  Info *pIStack_90;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_88;
  
  local_108 = (size_t)attributes._M_extent._M_extent_value;
  local_110 = attributes._M_ptr;
  TVar11 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar11.info;
  local_e8 = TVar11._0_8_;
  TVar11 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_100 = TVar11.info;
  local_f8 = TVar11._0_8_;
  local_118 = parseAssertionItemPortList(this,CheckerDeclaration);
  TVar11 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_128 = TVar11.info;
  local_120 = TVar11._0_8_;
  local_144 = this->currentDefinitionKind;
  this->currentDefinitionKind = CheckerDeclaration;
  Token::Token(&local_e0);
  local_88.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_88.super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_88.super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_145 = false;
  local_130 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_138 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar9 = 0;
  do {
    TVar11 = ParserBase::peek(&this->super_ParserBase);
    bVar5 = false;
    if ((TVar11.kind != EndOfFile) && ((TVar11._0_4_ & 0xffff) != 0x90)) {
      local_140 = parseMember(this,CheckerDeclaration,&local_145);
      if (local_140 == (MemberSyntax *)0x0) {
        bVar5 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar11.kind);
        if (bVar5) {
          local_d0 = ParserBase::peek(&this->super_ParserBase);
          range = Token::range(&local_d0);
          this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
          local_d0 = ParserBase::peek(&this->super_ParserBase);
          arg = Token::valueText(&local_d0);
          Diagnostic::operator<<(this_00,arg);
          bVar9 = 1;
          if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
             ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
            SVar7 = Token::location(local_130);
            Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar7);
            SVar7 = Token::location(local_138);
            Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar7);
          }
        }
        bVar10 = ~bVar9;
        bVar9 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar10 & 1) << 0x20 | 0x450005));
      }
      else {
        checkMemberAllowed(this,&local_140->super_SyntaxNode,CheckerDeclaration);
        SmallVectorBase<slang::syntax::MemberSyntax*>::
        emplace_back<slang::syntax::MemberSyntax*const&>
                  ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_88,&local_140);
        pSVar1 = this->previewNode;
        this->previewNode = (SyntaxNode *)0x0;
        (local_140->super_SyntaxNode).previewNode = pSVar1;
        bVar9 = 0;
      }
      bVar5 = true;
    }
  } while (bVar5);
  if (local_145 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  local_e0 = ParserBase::expect(&this->super_ParserBase,EndCheckerKeyword);
  iVar6 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_e0.info);
  if ((SyntaxNode **)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      &local_88.super_SyntaxListBase.super_SyntaxNode.previewNode) {
    operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  this->currentDefinitionKind = local_144;
  endBlock = parseNamedBlockClause(this);
  uVar3 = local_f8;
  pIVar2 = local_100;
  TVar11.info = local_100;
  TVar11.kind = (undefined2)local_f8;
  TVar11._2_1_ = local_f8._2_1_;
  TVar11.numFlags.raw = local_f8._3_1_;
  TVar11.rawLen = local_f8._4_4_;
  checkBlockNames(this,TVar11,endBlock);
  uVar4 = local_f8;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.childCount = local_108;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_110;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_108;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d2a10;
  local_98 = local_120;
  pIStack_90 = local_128;
  local_d0.info._0_4_ = 1;
  local_c0 = (SyntaxNode *)0x0;
  pSStack_b8 = (SyntaxNode *)0x0;
  local_d0._0_8_ = &PTR_getChild_005d55d0;
  semi.info = local_128;
  semi.kind = (undefined2)local_120;
  semi._2_1_ = local_120._2_1_;
  semi.numFlags.raw = local_120._3_1_;
  semi.rawLen = local_120._4_4_;
  keyword.info = local_f0;
  keyword.kind = (undefined2)local_e8;
  keyword._2_1_ = local_e8._2_1_;
  keyword.numFlags.raw = local_e8._3_1_;
  keyword.rawLen = local_e8._4_4_;
  name.info = pIVar2;
  local_f8._0_2_ = (undefined2)uVar3;
  local_f8._2_1_ = SUB81(uVar3,2);
  local_f8._3_1_ = SUB81(uVar3,3);
  local_f8._4_4_ = SUB84(uVar3,4);
  name.kind = (undefined2)local_f8;
  name._2_1_ = local_f8._2_1_;
  name.numFlags.raw = local_f8._3_1_;
  name.rawLen = local_f8._4_4_;
  local_f8 = uVar4;
  local_a8 = (pointer)CONCAT44(extraout_var,iVar6);
  pCVar8 = slang::syntax::SyntaxFactory::checkerDeclaration
                     (&this->factory,&local_88,keyword,name,local_118,semi,
                      (SyntaxList<slang::syntax::MemberSyntax> *)&local_d0,local_e0,endBlock);
  return pCVar8;
}

Assistant:

CheckerDeclarationSyntax& Parser::parseCheckerDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::CheckerDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = SyntaxKind::CheckerDeclaration;

    Token end;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndCheckerKeyword, end, SyntaxKind::CheckerDeclaration,
        [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.checkerDeclaration(attributes, keyword, name, portList, semi, members, end,
                                      blockName);
}